

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StripTargetFeatures.cpp
# Opt level: O0

Pass * wasm::createStripTargetFeaturesPass(void)

{
  StripTargetFeatures *this;
  
  this = (StripTargetFeatures *)operator_new(0x60);
  StripTargetFeatures::StripTargetFeatures(this,true);
  return &this->super_Pass;
}

Assistant:

Pass* createStripTargetFeaturesPass() { return new StripTargetFeatures(true); }